

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O2

int CheckDevicesState(void)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uStack_18;
  int bON;
  
  uStack_18 = (ulong)in_EAX;
  iVar1 = GetDeviceCurrentState("CurArmadeusState.txt",&bON);
  iVar2 = 1;
  if (iVar1 != 0) {
    return 1;
  }
  if (bON != bArmadeusON) {
    if (bON == 0) {
      iVar1 = SetRelayOntrak(&ontrak,0,0);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar3 = "Armadeus : OFF.";
    }
    else {
      iVar1 = SetRelayOntrak(&ontrak,0,1);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar3 = "Armadeus : ON.";
    }
    puts(pcVar3);
    fflush(_stdout);
    bArmadeusON = bON;
  }
  iVar1 = GetDeviceCurrentState("CurBottomPumpState.txt",&bON);
  if (iVar1 != 0) {
    return 1;
  }
  if (bON != bBottomPumpON) {
    if (bON == 0) {
      iVar1 = SetRelayOntrak(&ontrak,1,1);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar3 = "Bottom pump : OFF.";
    }
    else {
      iVar1 = SetRelayOntrak(&ontrak,1,0);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar3 = "Bottom pump : ON.";
    }
    puts(pcVar3);
    fflush(_stdout);
    bBottomPumpON = bON;
  }
  iVar1 = GetDeviceCurrentState("CurSurfacePumpState.txt",&bON);
  if (iVar1 != 0) {
    return 1;
  }
  if (bON != bSurfacePumpON) {
    if (bON == 0) {
      iVar1 = SetRelayOntrak(&ontrak,2,1);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar3 = "Surface pump : OFF.";
    }
    else {
      iVar1 = SetRelayOntrak(&ontrak,2,0);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar3 = "Surface pump : ON.";
    }
    puts(pcVar3);
    fflush(_stdout);
    bSurfacePumpON = bON;
  }
  iVar1 = GetDeviceCurrentState("CurProbeState.txt",&bON);
  if (iVar1 != 0) {
    return 1;
  }
  if (bON != bProbeON) {
    if (bON == 0) {
      iVar1 = SetRelayOntrak(&ontrak,4,1);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar3 = "Probe : OFF.";
    }
    else {
      iVar1 = SetRelayOntrak(&ontrak,4,0);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar3 = "Probe : ON.";
    }
    puts(pcVar3);
    fflush(_stdout);
    bProbeON = bON;
  }
  iVar1 = GetDeviceCurrentState("CurWifiState.txt",&bON);
  if (iVar1 == 0) {
    if (bON != bWifiON) {
      if (bON == 0) {
        iVar1 = SetRelayOntrak(&ontrak,3,0);
        if (iVar1 != 0) {
          return 1;
        }
        pcVar3 = "Wi-Fi : OFF.";
      }
      else {
        iVar1 = SetRelayOntrak(&ontrak,3,1);
        if (iVar1 != 0) {
          return 1;
        }
        pcVar3 = "Wi-Fi : ON.";
      }
      puts(pcVar3);
      fflush(_stdout);
      bWifiON = bON;
    }
    iVar1 = GetDeviceCurrentState("CurIridiumState.txt",&bON);
    if (iVar1 == 0) {
      if (bON != bIridiumON) {
        if (bON == 0) {
          iVar1 = SetDigitalRelayOntrak(&ontrak,6,1);
          if (iVar1 != 0) {
            return 1;
          }
          pcVar3 = "Iridium : OFF.";
        }
        else {
          iVar1 = SetDigitalRelayOntrak(&ontrak,6,0);
          if (iVar1 != 0) {
            return 1;
          }
          pcVar3 = "Iridium : ON.";
        }
        puts(pcVar3);
        fflush(_stdout);
        bIridiumON = bON;
      }
      iVar1 = GetDeviceCurrentState("CurSailMotorState.txt",&bON);
      if (iVar1 == 0) {
        iVar2 = 0;
        if (bON != bSailMotorON) {
          if (bON == 0) {
            iVar1 = SetDigitalRelayOntrak(&ontrak,7,1);
            if (iVar1 != 0) {
              return 1;
            }
            pcVar3 = "Sail motor : OFF.";
          }
          else {
            iVar1 = SetDigitalRelayOntrak(&ontrak,7,0);
            if (iVar1 != 0) {
              return 1;
            }
            pcVar3 = "Sail motor : ON.";
          }
          puts(pcVar3);
          fflush(_stdout);
          bSailMotorON = bON;
          iVar2 = 0;
        }
      }
      return iVar2;
    }
    return 1;
  }
  return 1;
}

Assistant:

int CheckDevicesState(void)
{
	int bON = 0;

	if (GetDeviceCurrentState("CurArmadeusState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bArmadeusON)
	{
		// Active-low.
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Armadeus : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Armadeus : OFF.\n"); fflush(stdout);
		}
		bArmadeusON = bON;
	}

	if (GetDeviceCurrentState("CurBottomPumpState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bBottomPumpON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Bottom pump : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Bottom pump : OFF.\n"); fflush(stdout);
		}
		bBottomPumpON = bON;
	}

	if (GetDeviceCurrentState("CurSurfacePumpState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bSurfacePumpON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Surface pump : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Surface pump : OFF.\n"); fflush(stdout);
		}
		bSurfacePumpON = bON;
	}

	if (GetDeviceCurrentState("CurProbeState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bProbeON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Probe : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Probe : OFF.\n"); fflush(stdout);
		}
		bProbeON = bON;
	}

	if (GetDeviceCurrentState("CurWifiState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bWifiON)
	{
		// Active-low.
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Wi-Fi : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Wi-Fi : OFF.\n"); fflush(stdout);
		}
		bWifiON = bON;
	}

	if (GetDeviceCurrentState("CurIridiumState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bIridiumON)
	{
		if (bON)
		{
			if (SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Iridium : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Iridium : OFF.\n"); fflush(stdout);
		}
		bIridiumON = bON;
	}

	if (GetDeviceCurrentState("CurSailMotorState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bSailMotorON)
	{
		if (bON)
		{
			if (SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Sail motor : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Sail motor : OFF.\n"); fflush(stdout);
		}
		bSailMotorON = bON;
	}

	return EXIT_SUCCESS;
}